

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reserve(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long *plVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  
  uVar8 = 4;
  if (this->ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    uVar8 = this->nAlloc;
  }
  if (uVar8 < n) {
    pmVar3 = (this->alloc).memoryResource;
    iVar7 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n << 5,8);
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var,iVar7);
    if (this->nStored != 0) {
      lVar12 = 0x10;
      uVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pbVar9->_M_dataplus)._M_p + lVar12);
        pbVar10 = this->ptr;
        if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &this->field_2;
        }
        puVar2 = (undefined8 *)((long)&pbVar10->_M_dataplus + lVar12);
        *(undefined8 **)((long)pbVar9 + lVar12 + -0x10) = puVar1;
        puVar4 = *(undefined8 **)((long)pbVar10 + lVar12 + -0x10);
        if (puVar2 == puVar4) {
          uVar6 = puVar2[1];
          *puVar1 = *puVar2;
          puVar1[1] = uVar6;
        }
        else {
          *(undefined8 **)((long)pbVar9 + lVar12 + -0x10) = puVar4;
          *(undefined8 *)((long)&(pbVar9->_M_dataplus)._M_p + lVar12) = *puVar2;
        }
        *(undefined8 *)((long)pbVar9 + lVar12 + -8) = *(undefined8 *)((long)pbVar10 + lVar12 + -8);
        *(undefined8 **)((long)pbVar10 + lVar12 + -0x10) = puVar2;
        *(undefined8 *)((long)pbVar10 + lVar12 + -8) = 0;
        *(undefined1 *)((long)&pbVar10->_M_dataplus + lVar12) = 0;
        pbVar10 = this->ptr;
        if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &this->field_2;
        }
        plVar5 = *(long **)((long)pbVar10 + lVar12 + -0x10);
        plVar11 = (long *)((long)&pbVar10->_M_dataplus + lVar12);
        if (plVar11 != plVar5) {
          operator_delete(plVar5,*plVar11 + 1);
        }
        uVar8 = uVar8 + 1;
        lVar12 = lVar12 + 0x20;
      } while (uVar8 < this->nStored);
    }
    pmVar3 = (this->alloc).memoryResource;
    (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc << 5,8);
    this->nAlloc = n;
    this->ptr = pbVar9;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }